

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O2

QString * __thiscall
QAccessibleTextWidget::attributes
          (QString *__return_storage_ptr__,QAccessibleTextWidget *this,int offset,int *startOffset,
          int *endOffset)

{
  char cVar1;
  byte bVar2;
  MoveMode MVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  UnderlineStyle t;
  VerticalAlignment VVar8;
  Alignment AVar9;
  QArrayDataPointer<char16_t> *pQVar10;
  QString *pQVar11;
  storage_type *psVar12;
  QDebug *pQVar13;
  char *pcVar14;
  QChar QVar15;
  MoveMode MVar16;
  long in_FS_OFFSET;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QBrush foreground;
  QArrayDataPointer<char16_t> *local_1c8;
  char *local_1c0;
  QArrayDataPointer<char16_t> local_1b8;
  QArrayDataPointer<char16_t> local_1a0;
  QBrush background;
  QByteArrayView local_180;
  QArrayDataPointer<char16_t> local_170;
  QByteArrayView local_158;
  QByteArrayView local_148;
  QArrayDataPointer<char16_t> local_138;
  QArrayDataPointer<char16_t> local_118;
  QTextCursor cursor;
  QArrayDataPointer<char16_t> local_f8;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [12];
  int iStack_9c;
  undefined1 *local_98;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 local_78 [32];
  QArrayDataPointer<char16_t> *local_58;
  char16_t local_50;
  char16_t local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (offset == -2) {
    offset = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0xe8))(this);
  }
  MVar3 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x118))(this);
  MVar16 = offset;
  if (offset == MVar3) {
    MVar16 = MVar3 - KeepAnchor;
  }
  if (offset == ~MoveAnchor) {
    MVar16 = MVar3 - KeepAnchor;
  }
  if ((int)MVar16 < 0 || (int)MVar3 < (int)MVar16) {
    *startOffset = -1;
    *endOffset = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_004d3ec2;
  }
  _cursor = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x158))(&cursor,this);
  QTextCursor::setPosition((int)&cursor,MVar16);
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::block();
  iVar4 = QTextBlock::position();
  iVar5 = QTextBlock::length();
  iVar5 = iVar5 + iVar4;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffff60 = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::begin();
  iVar7 = iVar4;
  while( true ) {
    if ((int)local_98 == iStack_9c) break;
    local_78._0_4_ = 0xaaaaaaaa;
    local_78._4_4_ = 0xaaaaaaaa;
    local_78._8_4_ = 0xaaaaaaaa;
    local_78._12_4_ = 0xaaaaaaaa;
    QTextBlock::iterator::fragment();
    cVar1 = QTextFragment::contains((int)local_78);
    if (cVar1 != '\0') break;
    iVar6 = QTextFragment::position();
    iVar7 = QTextFragment::length();
    iVar7 = iVar7 + iVar6;
    QTextBlock::iterator::operator++((iterator *)local_a8);
  }
  local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_b8);
  if ((int)local_98 == iStack_9c) {
    QTextBlock::charFormat();
    QTextFormat::operator=((QTextFormat *)local_b8,(QTextFormat *)local_78);
    QTextFormat::~QTextFormat((QTextFormat *)local_78);
    *startOffset = iVar7;
  }
  else {
    local_78._0_4_ = 0xaaaaaaaa;
    local_78._4_4_ = 0xaaaaaaaa;
    local_78._8_4_ = 0xaaaaaaaa;
    local_78._12_4_ = 0xaaaaaaaa;
    QTextBlock::iterator::fragment();
    QTextFragment::charFormat();
    QTextFormat::operator=((QTextFormat *)local_b8,(QTextFormat *)&local_f8);
    QTextFormat::~QTextFormat((QTextFormat *)&local_f8);
    iVar7 = QTextFragment::position();
    if (iVar4 < iVar7) {
      iVar4 = iVar7;
    }
    *startOffset = iVar4;
    iVar4 = QTextFragment::length();
    if (iVar4 + iVar7 < iVar5) {
      iVar5 = iVar4 + iVar7;
    }
  }
  *endOffset = iVar5;
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::blockFormat();
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::font();
  local_f8.size = 0;
  local_f8.d = (Data *)0x0;
  local_f8.ptr = (char16_t *)0x0;
  local_118.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_118.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_118.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFont::families();
  local_138.size = 0;
  local_138.d = (Data *)0x0;
  local_138.ptr = (char16_t *)0x0;
  if (CONCAT44(local_78._20_4_,CONCAT22(local_78._18_2_,local_78._16_2_)) == 0) {
    pQVar10 = &local_138;
  }
  else {
    pQVar10 = (QArrayDataPointer<char16_t> *)CONCAT44(local_78._12_4_,local_78._8_4_);
  }
  local_118.d = pQVar10->d;
  local_118.ptr = pQVar10->ptr;
  local_118.size = pQVar10->size;
  if (local_118.d != (Data *)0x0) {
    LOCK();
    ((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_78);
  if (local_118.size != 0) {
    QVar15.ucs = (char16_t)&local_118;
    pQVar11 = (QString *)QString::replace(QVar15,(QLatin1String *)0x5c,2);
    QString::operator=((QString *)&local_118,pQVar11);
    pQVar11 = (QString *)QString::replace(QVar15,(QLatin1String *)0x3a,2);
    QString::operator=((QString *)&local_118,pQVar11);
    pQVar11 = (QString *)QString::replace(QVar15,(QLatin1String *)0x2c,2);
    QString::operator=((QString *)&local_118,pQVar11);
    pQVar11 = (QString *)QString::replace(QVar15,(QLatin1String *)0x3d,2);
    QString::operator=((QString *)&local_118,pQVar11);
    pQVar11 = (QString *)QString::replace(QVar15,(QLatin1String *)0x3b,2);
    QString::operator=((QString *)&local_118,pQVar11);
    pQVar11 = (QString *)QString::replace(QVar15,(QLatin1String *)0x22,2);
    QString::operator=((QString *)&local_118,pQVar11);
    QLatin1String::QLatin1String((QLatin1String *)&local_138,"font-family");
    local_78._0_4_ = SUB84(local_138.d,0);
    local_78._4_4_ = (undefined4)((ulong)local_138.d >> 0x20);
    local_78._8_4_ = SUB84(local_138.ptr,0);
    local_78._12_4_ = (undefined4)((ulong)local_138.ptr >> 0x20);
    local_78._24_2_ = 0x22;
    local_50 = L'\"';
    local_78._16_2_ = L':';
    local_48 = L';';
    local_58 = &local_118;
    operator+=((QString *)&local_f8,
               (QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_char16_t>,_QStringBuilder<QStringBuilder<char16_t,_QString_&>,_char16_t>_>,_char16_t>
                *)local_78);
  }
  iVar7 = QFont::pointSize();
  if (iVar7 != 0) {
    psVar12 = (storage_type *)QByteArrayView::lengthHelperCharArray("%1pt",5);
    QVar17.m_data = psVar12;
    QVar17.m_size = (qsizetype)&local_138;
    QString::fromLatin1(QVar17);
    QString::arg<int,_true>((QString *)local_78,(QString *)&local_138,iVar7,0,10,(QChar)0x20);
    local_170.d = (Data *)&local_f8;
    local_170.ptr = L"font-size";
    (anonymous_namespace)::AttributeFormatterRef::operator=
              ((AttributeFormatterRef *)&local_170,(QString *)local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  }
  iVar7 = QFont::weight();
  local_170.d = (Data *)0x66f7ef;
  if (iVar7 < 0x191) {
    local_170.d = (Data *)0x66f7f4;
  }
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_148,(char **)&local_170);
  QVar18.m_data = (storage_type *)local_148.m_size;
  QVar18.m_size = (qsizetype)local_78;
  QString::fromLatin1(QVar18);
  local_138.ptr = L"font-weight";
  local_138.d = (Data *)&local_f8;
  (anonymous_namespace)::AttributeFormatterRef::operator=
            ((AttributeFormatterRef *)&local_138,(QString *)local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
  iVar7 = QFont::style();
  pcVar14 = "oblique";
  if (iVar7 != 2) {
    pcVar14 = "normal";
  }
  local_170.d = (Data *)"italic";
  if (iVar7 != 1) {
    local_170.d = (Data *)pcVar14;
  }
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_158,(char **)&local_170);
  QVar19.m_data = (storage_type *)local_158.m_size;
  QVar19.m_size = (qsizetype)local_78;
  QString::fromLatin1(QVar19);
  local_138.ptr = L"font-style";
  local_138.d = (Data *)&local_f8;
  (anonymous_namespace)::AttributeFormatterRef::operator=
            ((AttributeFormatterRef *)&local_138,(QString *)local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
  bVar2 = QFont::strikeOut();
  pcVar14 = "none";
  if (bVar2 != 0) {
    pcVar14 = "single";
  }
  QLatin1String::QLatin1String((QLatin1String *)&local_138,"text-line-through-type");
  local_78._0_4_ = SUB84(local_138.d,0);
  local_78._4_4_ = (undefined4)((ulong)local_138.d >> 0x20);
  local_78._8_4_ = SUB84(local_138.ptr,0);
  local_78._12_4_ = (undefined4)((ulong)local_138.ptr >> 0x20);
  local_78._16_2_ = L':';
  local_50 = L';';
  local_78._24_8_ = (QArrayDataPointer<char16_t> *)((ulong)bVar2 * 2 + 4);
  local_58 = (QArrayDataPointer<char16_t> *)pcVar14;
  operator+=((QString *)&local_f8,
             (QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_char16_t>,_QLatin1String>,_char16_t>
              *)local_78);
  t = QTextCharFormat::underlineStyle((QTextCharFormat *)local_b8);
  if (t == NoUnderline) {
    cVar1 = QFont::underline();
    if (cVar1 != '\0') goto switchD_004d36f0_caseD_1;
    local_138.d = (Data *)0x0;
    local_138.ptr = (char16_t *)0x0;
    local_138.size = 0;
    goto LAB_004d38ad;
  }
  local_138.size = 0;
  local_138.d = (Data *)0x0;
  local_138.ptr = (char16_t *)0x0;
  switch(t) {
  case SingleUnderline:
switchD_004d36f0_caseD_1:
    local_170.d = (Data *)0x0;
    local_170.ptr = (char16_t *)0x0;
    local_170.size = 0;
    local_138.d = (Data *)0x0;
    local_78._0_4_ = 0;
    local_78._4_4_ = 0;
    local_138.ptr = L"solid";
    local_78._8_4_ = 0;
    local_78._12_4_ = 0;
    local_78._16_2_ = L'\0';
    local_78._18_2_ = 0;
    local_78._20_4_ = 0;
    local_138.size = 5;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_170);
    if (local_138.ptr == (char16_t *)0x0) goto LAB_004d38ad;
    goto LAB_004d3809;
  case DashUnderline:
  case DotLine:
    local_138.ptr = L"dash";
    goto LAB_004d37e4;
  case DashDotLine:
    local_138.ptr = L"dot-dash";
    local_138.size = 8;
    break;
  case DashDotDotLine:
    local_138.ptr = L"dot-dot-dash";
    local_138.size = 0xc;
    break;
  case WaveUnderline:
  case SpellCheckUnderline:
    local_138.ptr = L"wave";
LAB_004d37e4:
    local_138.size = 4;
    break;
  default:
    local_78._0_4_ = 2;
    local_78._20_4_ = 0;
    local_78._4_4_ = 0;
    local_78._8_4_ = 0;
    local_78._12_4_ = 0;
    local_78._16_2_ = L'\0';
    local_78._18_2_ = 0;
    local_78._24_8_ = "default";
    QMessageLogger::warning();
    pQVar13 = QDebug::operator<<((QDebug *)&local_170,
                                 "Unknown QTextCharFormat::UnderlineStyle value ");
    pQVar13 = QDebug::operator<<(pQVar13,t);
    QDebug::operator<<(pQVar13," could not be translated to IAccessible2 value");
    QDebug::~QDebug((QDebug *)&local_170);
    goto LAB_004d38ad;
  }
  local_78._20_4_ = 0;
  local_78._18_2_ = 0;
  local_78._16_2_ = L'\0';
  local_78._12_4_ = 0;
  local_78._8_4_ = 0;
  local_78._4_4_ = 0;
  local_78._0_4_ = 0;
  local_138.d = (Data *)0x0;
  local_170.size = 0;
  local_170.ptr = (char16_t *)0x0;
  local_170.d = (Data *)0x0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_170);
LAB_004d3809:
  QLatin1String::QLatin1String((QLatin1String *)&local_170,"text-underline-style");
  local_78._0_4_ = SUB84(local_170.d,0);
  local_78._4_4_ = (undefined4)((ulong)local_170.d >> 0x20);
  local_78._8_4_ = SUB84(local_170.ptr,0);
  local_78._12_4_ = (undefined4)((ulong)local_170.ptr >> 0x20);
  local_78._16_2_ = L':';
  local_58 = (QArrayDataPointer<char16_t> *)CONCAT62(local_58._2_6_,0x3b);
  local_78._24_8_ = &local_138;
  operator+=((QString *)&local_f8,
             (QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_char16_t>,_QString_&>,_char16_t>
              *)local_78);
  local_78._0_4_ = 0;
  local_78._4_4_ = 0;
  local_170.d = (Data *)0x0;
  local_170.ptr = (char16_t *)0x0;
  local_78._8_4_ = 0x66f93e;
  local_78._12_4_ = 0;
  local_170.size = 0;
  local_78._16_2_ = L'\x06';
  local_78._18_2_ = 0;
  local_78._20_4_ = 0;
  local_1a0.ptr = L"text-underline-type";
  local_1a0.d = (Data *)&local_f8;
  (anonymous_namespace)::AttributeFormatterRef::operator=
            ((AttributeFormatterRef *)&local_1a0,(QString *)local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_170);
LAB_004d38ad:
  iVar7 = QTextBlock::textDirection();
  if (iVar7 == 1) {
    local_78._0_4_ = 0;
    local_78._4_4_ = 0;
    local_170.d = (Data *)0x0;
    local_170.ptr = (char16_t *)0x0;
    local_78._8_4_ = 0x66f94c;
    local_78._12_4_ = 0;
    local_170.size = 0;
    local_78._16_2_ = L'\x02';
    local_78._18_2_ = 0;
    local_78._20_4_ = 0;
    local_1a0.ptr = L"writing-mode";
    local_1a0.d = (Data *)&local_f8;
    (anonymous_namespace)::AttributeFormatterRef::operator=
              ((AttributeFormatterRef *)&local_1a0,(QString *)local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_170);
  }
  VVar8 = QTextCharFormat::verticalAlignment((QTextCharFormat *)local_b8);
  pcVar14 = "baseline";
  if (VVar8 == AlignSuperScript) {
    pcVar14 = "super";
  }
  local_1a0.d = (Data *)"sub";
  if (VVar8 != AlignSubScript) {
    local_1a0.d = (Data *)pcVar14;
  }
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_180,(char **)&local_1a0);
  QVar20.m_data = (storage_type *)local_180.m_size;
  QVar20.m_size = (qsizetype)local_78;
  QString::fromLatin1(QVar20);
  local_170.ptr = L"text-position";
  local_170.d = (Data *)&local_f8;
  (anonymous_namespace)::AttributeFormatterRef::operator=
            ((AttributeFormatterRef *)&local_170,(QString *)local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
  _background = &DAT_aaaaaaaaaaaaaaaa;
  QTextFormat::background((QTextFormat *)&background);
  if (*(int *)(_background + 4) == 1) {
    psVar12 = (storage_type *)QByteArrayView::lengthHelperCharArray("rgb(%1,%2,%3)",0xe);
    QVar21.m_data = psVar12;
    QVar21.m_size = (qsizetype)&local_1b8;
    QString::fromLatin1(QVar21);
    iVar7 = QColor::red();
    QString::arg<int,_true>((QString *)&local_1a0,(QString *)&local_1b8,iVar7,0,10,(QChar)0x20);
    iVar7 = QColor::green();
    QString::arg<int,_true>((QString *)&local_170,(QString *)&local_1a0,iVar7,0,10,(QChar)0x20);
    iVar7 = QColor::blue();
    QString::arg<int,_true>((QString *)local_78,(QString *)&local_170,iVar7,0,10,(QChar)0x20);
    local_1c0 = "background-color";
    local_1c8 = &local_f8;
    (anonymous_namespace)::AttributeFormatterRef::operator=
              ((AttributeFormatterRef *)&local_1c8,(QString *)local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_170);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b8);
  }
  _foreground = &DAT_aaaaaaaaaaaaaaaa;
  QTextFormat::foreground((QTextFormat *)&foreground);
  if (*(int *)(_foreground + 4) == 1) {
    psVar12 = (storage_type *)QByteArrayView::lengthHelperCharArray("rgb(%1,%2,%3)",0xe);
    QVar22.m_data = psVar12;
    QVar22.m_size = (qsizetype)&local_1b8;
    QString::fromLatin1(QVar22);
    iVar7 = QColor::red();
    QString::arg<int,_true>((QString *)&local_1a0,(QString *)&local_1b8,iVar7,0,10,(QChar)0x20);
    iVar7 = QColor::green();
    QString::arg<int,_true>((QString *)&local_170,(QString *)&local_1a0,iVar7,0,10,(QChar)0x20);
    iVar7 = QColor::blue();
    QString::arg<int,_true>((QString *)local_78,(QString *)&local_170,iVar7,0,10,(QChar)0x20);
    local_1c0 = "color";
    local_1c8 = &local_f8;
    (anonymous_namespace)::AttributeFormatterRef::operator=
              ((AttributeFormatterRef *)&local_1c8,(QString *)local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_170);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b8);
  }
  AVar9 = QTextBlockFormat::alignment((QTextBlockFormat *)&local_c8);
  switch((uint)AVar9.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i & 0xf) {
  case 1:
    local_78._8_4_ = 0x66f952;
    local_78._16_2_ = L'\x04';
    break;
  case 2:
    local_78._8_4_ = 0x66f95c;
    local_78._16_2_ = L'\x05';
    break;
  default:
    goto switchD_004d3bfc_caseD_3;
  case 4:
    local_78._8_4_ = 0x66f968;
    local_78._16_2_ = L'\x06';
    break;
  case 8:
    local_78._8_4_ = 0x66f976;
    local_78._16_2_ = L'\a';
  }
  local_78._20_4_ = 0;
  local_78._18_2_ = 0;
  local_78._12_4_ = 0;
  local_78._4_4_ = 0;
  local_78._0_4_ = 0;
  local_170.size = 0;
  local_170.ptr = (char16_t *)0x0;
  local_170.d = (Data *)0x0;
  local_1a0.ptr = L"text-align";
  local_1a0.d = (Data *)&local_f8;
  (anonymous_namespace)::AttributeFormatterRef::operator=
            ((AttributeFormatterRef *)&local_1a0,(QString *)local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_170);
switchD_004d3bfc_caseD_3:
  (__return_storage_ptr__->d).d = local_f8.d;
  (__return_storage_ptr__->d).ptr = local_f8.ptr;
  (__return_storage_ptr__->d).size = local_f8.size;
  if (local_f8.d != (Data *)0x0) {
    LOCK();
    ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QBrush::~QBrush(&foreground);
  QBrush::~QBrush(&background);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  QFont::~QFont((QFont *)&local_d8);
  QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
  QTextFormat::~QTextFormat((QTextFormat *)local_b8);
  QTextCursor::~QTextCursor(&cursor);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_004d3ec2:
  __stack_chk_fail();
}

Assistant:

QString QAccessibleTextWidget::attributes(int offset, int *startOffset, int *endOffset) const
{
    /* The list of attributes can be found at:
     http://linuxfoundation.org/collaborate/workgroups/accessibility/iaccessible2/textattributes
    */

    // IAccessible2 defines -1 as length and -2 as cursor position
    if (offset == -2)
        offset = cursorPosition();

    const int charCount = characterCount();

    // -1 doesn't make much sense here, but it's better to return something
    // screen readers may ask for text attributes at the cursor pos which may be equal to length
    if (offset == -1 || offset == charCount)
        offset = charCount - 1;

    if (offset < 0 || offset > charCount) {
        *startOffset = -1;
        *endOffset = -1;
        return QString();
    }


    QTextCursor cursor = textCursor();
    cursor.setPosition(offset);
    QTextBlock block = cursor.block();

    int blockStart = block.position();
    int blockEnd = blockStart + block.length();

    QTextBlock::iterator iter = block.begin();
    int lastFragmentIndex = blockStart;
    while (!iter.atEnd()) {
        QTextFragment f = iter.fragment();
        if (f.contains(offset))
            break;
        lastFragmentIndex = f.position() + f.length();
        ++iter;
    }

    QTextCharFormat charFormat;
    if (!iter.atEnd()) {
        QTextFragment fragment = iter.fragment();
        charFormat = fragment.charFormat();
        int pos = fragment.position();
        // text block and fragment may overlap, use the smallest common range
        *startOffset = qMax(pos, blockStart);
        *endOffset = qMin(pos + fragment.length(), blockEnd);
    } else {
        charFormat = block.charFormat();
        *startOffset = lastFragmentIndex;
        *endOffset = blockEnd;
    }
    Q_ASSERT(*startOffset <= offset);
    Q_ASSERT(*endOffset >= offset);

    QTextBlockFormat blockFormat = cursor.blockFormat();

    const QFont charFormatFont = charFormat.font();

    AttributeFormatter attrs;
    QString family = charFormatFont.families().value(0, QString());
    if (!family.isEmpty()) {
        family = family.replace(u'\\', "\\\\"_L1);
        family = family.replace(u':', "\\:"_L1);
        family = family.replace(u',', "\\,"_L1);
        family = family.replace(u'=', "\\="_L1);
        family = family.replace(u';', "\\;"_L1);
        family = family.replace(u'\"', "\\\""_L1);
        attrs["font-family"] = u'"' + family + u'"';
    }

    int fontSize = int(charFormatFont.pointSize());
    if (fontSize)
        attrs["font-size"] = QString::fromLatin1("%1pt").arg(fontSize);

    //Different weight values are not handled
    attrs["font-weight"] = QString::fromLatin1(charFormatFont.weight() > QFont::Normal ? "bold" : "normal");

    QFont::Style style = charFormatFont.style();
    attrs["font-style"] = QString::fromLatin1((style == QFont::StyleItalic) ? "italic" : ((style == QFont::StyleOblique) ? "oblique": "normal"));

    attrs["text-line-through-type"] = charFormatFont.strikeOut() ? "single"_L1 : "none"_L1;

    QTextCharFormat::UnderlineStyle underlineStyle = charFormat.underlineStyle();
    if (underlineStyle == QTextCharFormat::NoUnderline && charFormatFont.underline()) // underline could still be set in the default font
        underlineStyle = QTextCharFormat::SingleUnderline;
    QString underlineStyleValue;
    switch (underlineStyle) {
        case QTextCharFormat::NoUnderline:
            break;
        case QTextCharFormat::SingleUnderline:
            underlineStyleValue = QStringLiteral("solid");
            break;
        case QTextCharFormat::DashUnderline:
            underlineStyleValue = QStringLiteral("dash");
            break;
        case QTextCharFormat::DotLine:
            underlineStyleValue = QStringLiteral("dash");
            break;
        case QTextCharFormat::DashDotLine:
            underlineStyleValue = QStringLiteral("dot-dash");
            break;
        case QTextCharFormat::DashDotDotLine:
            underlineStyleValue = QStringLiteral("dot-dot-dash");
            break;
        case QTextCharFormat::WaveUnderline:
            underlineStyleValue = QStringLiteral("wave");
            break;
        case QTextCharFormat::SpellCheckUnderline:
            underlineStyleValue = QStringLiteral("wave"); // this is not correct, but provides good approximation at least
            break;
        default:
            qWarning() << "Unknown QTextCharFormat::UnderlineStyle value " << underlineStyle << " could not be translated to IAccessible2 value";
            break;
    }
    if (!underlineStyleValue.isNull()) {
        attrs["text-underline-style"] = underlineStyleValue;
        attrs["text-underline-type"] = QStringLiteral("single"); // if underlineStyleValue is set, there is an underline, and Qt does not support other than single ones
    } // else both are "none" which is the default - no need to set them

    if (block.textDirection() == Qt::RightToLeft)
        attrs["writing-mode"] = QStringLiteral("rl");

    QTextCharFormat::VerticalAlignment alignment = charFormat.verticalAlignment();
    attrs["text-position"] = QString::fromLatin1((alignment == QTextCharFormat::AlignSubScript) ? "sub" : ((alignment == QTextCharFormat::AlignSuperScript) ? "super" : "baseline" ));

    QBrush background = charFormat.background();
    if (background.style() == Qt::SolidPattern) {
        attrs["background-color"] = QString::fromLatin1("rgb(%1,%2,%3)").arg(background.color().red()).arg(background.color().green()).arg(background.color().blue());
    }

    QBrush foreground = charFormat.foreground();
    if (foreground.style() == Qt::SolidPattern) {
        attrs["color"] = QString::fromLatin1("rgb(%1,%2,%3)").arg(foreground.color().red()).arg(foreground.color().green()).arg(foreground.color().blue());
    }

    switch (blockFormat.alignment() & (Qt::AlignLeft | Qt::AlignRight | Qt::AlignHCenter | Qt::AlignJustify)) {
    case Qt::AlignLeft:
        attrs["text-align"] = QStringLiteral("left");
        break;
    case Qt::AlignRight:
        attrs["text-align"] = QStringLiteral("right");
        break;
    case Qt::AlignHCenter:
        attrs["text-align"] = QStringLiteral("center");
        break;
    case Qt::AlignJustify:
        attrs["text-align"] = QStringLiteral("justify");
        break;
    }

    return attrs.toFormatted();
}